

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rom_loader.c
# Opt level: O3

_Bool load_rom(char *rom_filename,_Bool debug_enabled)

{
  short sVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  byte bVar17;
  int iVar18;
  FILE *pFVar19;
  size_t __size;
  uint8_t *rom_data;
  size_t sVar20;
  iNES_1_0_header header;
  uint uVar21;
  char *__s;
  uint uVar22;
  
  pFVar19 = fopen(rom_filename,"rb");
  printf("Opening rom %s for loading\n");
  if (rom_filename == (char *)0x0) {
    printf("ERROR: Failed to open rom file %s\n");
  }
  if (pFVar19 != (FILE *)0x0) {
    iVar18 = fseek(pFVar19,0,2);
    if (iVar18 == 0) {
      __size = ftell(pFVar19);
      if (__size == 0xffffffffffffffff) {
        __s = "ERROR: ftell failed to get the size of the rom image";
      }
      else {
        iVar18 = fseek(pFVar19,0,0);
        if (iVar18 == 0) {
          rom_data = (uint8_t *)malloc(__size);
          if (rom_data != (uint8_t *)0x0) {
            sVar20 = fread(rom_data,1,__size,pFVar19);
            fclose(pFVar19);
            if (sVar20 != __size) {
              printf("ERROR: Only read %u bytes when expecting %u bytes.\n",sVar20 & 0xffffffff,
                     __size & 0xffffffff);
              return true;
            }
            parse_iNes_1_0_header(rom_data);
            parse_PRG_rom(rom_data);
            parse_CHR_rom(rom_data);
            free(rom_data);
            header = get_iNes_1_0_header();
            print_iNes_1_0_header(header);
            if ((ulong)header >> 0x38 != 0) {
              printf("ERROR: Mapper %u does not match any supported mappers\n",(ulong)header >> 0x38
                    );
              return true;
            }
            init_NROM();
            if (!debug_enabled) {
              return false;
            }
            pFVar19 = fopen("rom_data.log","w");
            if (pFVar19 != (FILE *)0x0) {
              uVar22 = 0x7ff0;
              do {
                uVar21 = uVar22 + 0x10;
                bVar2 = debug_read_RAM((uint16_t)uVar21);
                sVar1 = (short)uVar22;
                bVar3 = debug_read_RAM(sVar1 + 0x11);
                bVar4 = debug_read_RAM(sVar1 + 0x12);
                bVar5 = debug_read_RAM(sVar1 + 0x13);
                bVar6 = debug_read_RAM(sVar1 + 0x14);
                bVar7 = debug_read_RAM(sVar1 + 0x15);
                bVar8 = debug_read_RAM(sVar1 + 0x16);
                bVar9 = debug_read_RAM(sVar1 + 0x17);
                bVar10 = debug_read_RAM(sVar1 + 0x18);
                bVar11 = debug_read_RAM(sVar1 + 0x19);
                bVar12 = debug_read_RAM(sVar1 + 0x1a);
                bVar13 = debug_read_RAM(sVar1 + 0x1b);
                bVar14 = debug_read_RAM(sVar1 + 0x1c);
                bVar15 = debug_read_RAM(sVar1 + 0x1d);
                bVar16 = debug_read_RAM(sVar1 + 0x1e);
                bVar17 = debug_read_RAM(sVar1 + 0x1f);
                fprintf(pFVar19,
                        "0x%04X: %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X %02X\n"
                        ,(ulong)uVar21,(ulong)bVar2,(ulong)bVar3,(ulong)bVar4,(ulong)bVar5,
                        (ulong)bVar6,(ulong)bVar7,(ulong)bVar8,(ulong)bVar9,(ulong)bVar10,
                        (ulong)bVar11,(ulong)bVar12,(ulong)bVar13,(ulong)bVar14,(ulong)bVar15,
                        (ulong)bVar16,(ulong)bVar17);
                uVar22 = uVar21;
              } while (uVar21 < 0xfff0);
              fclose(pFVar19);
              return false;
            }
            puts("ERROR: rom_data.log failed to open");
            exit(1);
          }
          __s = "ERROR: Failed to malloc memory block for rom data";
        }
        else {
          __s = "ERROR: Failed to move to START of file";
        }
      }
    }
    else {
      __s = "ERROR: Failed to move to END of file";
    }
    puts(__s);
  }
  return true;
}

Assistant:

bool load_rom(const char* rom_filename, bool debug_enabled) {
    if(read_rom(rom_filename)) {
        return true;
    }

    iNES_1_0_header parsed_header = get_iNes_1_0_header();
    print_iNes_1_0_header(parsed_header);
    switch(parsed_header.mapper) {
        case 0:
            init_NROM();
            break;
        default:
            printf("ERROR: Mapper %u does not match any supported mappers\n", parsed_header.mapper);
            return true;
    }

    if(debug_enabled) {
        print_rom_data();
    }
    return false;
}